

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O3

bool __thiscall cursespp::LayoutBase::SetFocus(LayoutBase *this,IWindowPtr *focus)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  pointer psVar6;
  ulong uVar7;
  LayoutBase *this_01;
  bool bVar8;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [32];
  
  peVar1 = (focus->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this->focused = -2;
    this_01 = (LayoutBase *)(local_40 + 0x10);
LAB_0016d13b:
    EnsureValidFocus(this_01);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this_01->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable;
    bVar8 = true;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    psVar6 = (this->focusable).
             super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->focusable).
                  super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6;
    if (lVar4 == 0) {
      bVar8 = false;
    }
    else {
      uVar5 = lVar4 >> 4;
      uVar7 = 0;
      do {
        if ((psVar6->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            peVar1) {
          iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x25])
                            (this);
          if (CONCAT44(extraout_var,iVar2) != 0) {
            plVar3 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&IWindow::typeinfo,
                                            &ILayout::typeinfo,0xfffffffffffffffe);
            if (plVar3 != (long *)0x0) {
              std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<cursespp::IWindow,void>
                        (local_50,(__weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)
                                  &(this->super_Window).
                                   super_enable_shared_from_this<cursespp::IWindow>);
              (**(code **)(*plVar3 + 0x60))(plVar3,local_50);
              if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
              }
            }
          }
          this->focused = (int)uVar7;
          this_01 = (LayoutBase *)local_40;
          goto LAB_0016d13b;
        }
        uVar7 = uVar7 + 1;
        psVar6 = psVar6 + 1;
      } while (uVar5 + (uVar5 == 0) != uVar7);
      bVar8 = uVar7 < uVar5;
    }
  }
  return bVar8;
}

Assistant:

bool LayoutBase::SetFocus(IWindowPtr focus) {
    if (!focus) {
        this->focused = NO_FOCUS;
        this->EnsureValidFocus();
        return true;
    }
    else {
        for (size_t i = 0; i < this->focusable.size(); i++) {
            if (this->focusable[i] == focus) {
                /* if we're focused, we need to ensure our parent sets its correct
                focus index to us! and so on up to the root view. note that this
                needs to be called before updating our internal focus; recursively,
                parents need to have their focus index set before children */
                auto asLayout = dynamic_cast<ILayout*>(this->GetParent());
                if (asLayout) {
                    asLayout->SetFocus(shared_from_this());
                }
                this->focused = i;
                this->EnsureValidFocus();
                return true;
            }
        }
    }
    return false;
}